

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void blend_untransformed_argb(int count,QT_FT_Span *spans,void *userData)

{
  char cVar1;
  int iVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar11;
  int iVar12;
  int iVar13;
  uchar *puVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  int iVar16;
  int iVar17;
  QSemaphore semaphore;
  Operator op;
  undefined1 *local_120;
  Operator *local_118;
  QT_FT_Span *local_110;
  undefined8 local_108;
  int local_100;
  int local_fc;
  int local_f8;
  undefined4 uStack_f4;
  void *local_f0;
  Operator local_e8;
  long local_38;
  uint uVar10;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)((long)userData + 0xd0) | 2) != 6) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      blend_untransformed_generic(count,spans,userData);
      return;
    }
    goto LAB_006566f2;
  }
  memcpy(&local_e8,&DAT_006ce8d0,0xb0);
  getOperator(&local_e8,(QSpanData *)userData,spans,count);
  iVar2 = *(int *)((long)userData + 0xb0);
  iVar13 = *(int *)((long)userData + 0xb4);
  iVar12 = *(int *)((long)userData + 0xe8);
  iVar16 = (int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                         0x3fe0000000000000) - *(double *)((long)userData + 0x70));
  iVar17 = (int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                         0x3fe0000000000000) - *(double *)((long)userData + 0x78));
  local_108 = CONCAT44(-iVar17,-iVar16);
  _local_f8 = CONCAT44(0xaaaaaaaa,iVar12);
  iVar11 = count + 0x5f;
  if (-1 < count + 0x20) {
    iVar11 = count + 0x20;
  }
  local_118 = &local_e8;
  local_110 = spans;
  local_100 = iVar13;
  local_fc = iVar2;
  local_f0 = userData;
  pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (count < 0x60) {
    if (0 < count) goto LAB_006565fa;
  }
  else {
    if ((pQVar3 != (QThreadPool *)0x0) && (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp))
    {
      QThread::currentThread();
      cVar1 = QThreadPool::contains((QThread *)pQVar3);
      if (cVar1 == '\0') {
        iVar11 = iVar11 >> 6;
        local_120 = &DAT_aaaaaaaaaaaaaaaa;
        iVar13 = 0;
        QSemaphore::QSemaphore((QSemaphore *)&local_120,0);
        iVar2 = 1;
        if (1 < iVar11) {
          iVar2 = iVar11;
        }
        iVar12 = 0;
        do {
          iVar16 = (count - iVar12) / (iVar11 + iVar13);
          puVar4 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar4 + 1) = 1;
          *puVar4 = QFactoryLoader::keyMap;
          puVar5 = (undefined8 *)operator_new(0x20);
          *puVar5 = QRunnable::QGenericRunnable::
                    Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4572:5)>
                    ::impl;
          *(int *)(puVar5 + 1) = iVar12;
          *(int *)((long)puVar5 + 0xc) = iVar16;
          puVar5[2] = &local_118;
          puVar5[3] = &local_120;
          puVar4[2] = puVar5;
          QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
          iVar12 = iVar12 + iVar16;
          iVar13 = iVar13 + -1;
        } while (-iVar2 != iVar13);
        QSemaphore::acquire((int)(QSemaphore *)&local_120);
        QSemaphore::~QSemaphore((QSemaphore *)&local_120);
        goto LAB_006566cd;
      }
    }
LAB_006565fa:
    uVar15 = (ulong)(uint)count;
    puVar14 = &spans->coverage;
    do {
      if (*(int *)(puVar14 + -8) != 0) {
        uVar6 = *(int *)(puVar14 + -4) - iVar17;
        if ((-1 < (int)uVar6) && ((int)uVar6 < iVar13)) {
          uVar8 = ((QT_FT_Span *)(puVar14 + -0xc))->x - iVar16;
          if ((int)uVar8 < iVar2) {
            uVar7 = 0;
            if (0 < (int)uVar8) {
              uVar7 = uVar8;
            }
            uVar10 = 0;
            if ((int)uVar8 < 0) {
              uVar10 = uVar8;
            }
            iVar9 = uVar10 + *(int *)(puVar14 + -8);
            iVar11 = iVar2 - uVar7;
            if ((int)(iVar9 + uVar7) <= iVar2) {
              iVar11 = iVar9;
            }
            if (0 < iVar11) {
              iVar9 = ((QT_FT_Span *)(puVar14 + -0xc))->x;
              if ((int)uVar8 < 0) {
                iVar9 = iVar16;
              }
              (*local_e8.func)((uint *)((long)*(int *)(puVar14 + -4) * *(long *)(*userData + 0x28) +
                                        *(long *)(*userData + 0x38) + (long)iVar9 * 4),
                               (uint *)((ulong)uVar6 * *(long *)((long)userData + 200) +
                                        *(long *)((long)userData + 0xa8) + (ulong)uVar7 * 4),iVar11,
                               (int)((uint)*puVar14 * iVar12) >> 8);
            }
          }
        }
      }
      puVar14 = puVar14 + 0x10;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
LAB_006566cd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_006566f2:
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    if (data->texture.format != QImage::Format_ARGB32_Premultiplied
        && data->texture.format != QImage::Format_RGB32) {
        blend_untransformed_generic(count, spans, userData);
        return;
    }

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    const int const_alpha = data->texture.const_alpha;
    const int xoff = -qRound(-data->dx);
    const int yoff = -qRound(-data->dy);

    auto function = [=, &op] (int cStart, int cEnd)
    {
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    const int coverage = (spans[c].coverage * const_alpha) >> 8;
                    const uint *src = (const uint *)data->texture.scanLine(sy) + sx;
                    uint *dest = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + x;
                    op.func(dest, src, length, coverage);
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}